

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O0

VulkanMemoryAllocation * __thiscall
VulkanUtilities::VulkanMemoryPage::Allocate
          (VulkanMemoryAllocation *__return_storage_ptr__,VulkanMemoryPage *this,VkDeviceSize size,
          VkDeviceSize alignment)

{
  VkDeviceSize VVar1;
  bool bVar2;
  unsigned_long uVar3;
  Char *pCVar4;
  char (*Args_1) [126];
  type tVar5;
  unsigned_long *in_R9;
  Allocation AVar6;
  undefined1 local_98 [8];
  string msg_1;
  Allocation Allocation;
  unsigned_long local_58;
  undefined1 local_50 [8];
  string msg;
  lock_guard<std::mutex> Lock;
  VkDeviceSize alignment_local;
  VkDeviceSize size_local;
  VulkanMemoryPage *this_local;
  
  alignment_local = size;
  size_local = (VkDeviceSize)this;
  this_local = (VulkanMemoryPage *)__return_storage_ptr__;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)((long)&msg.field_2 + 8),&this->m_Mutex);
  VVar1 = alignment_local;
  uVar3 = std::numeric_limits<unsigned_long>::max();
  if (uVar3 < VVar1) {
    local_58 = std::numeric_limits<unsigned_long>::max();
    Diligent::FormatString<char[18],unsigned_long,char[33],unsigned_long>
              ((string *)local_50,(Diligent *)"Allocation size (",(char (*) [18])&alignment_local,
               (unsigned_long *)") exceeds maximum allowed value ",(char (*) [33])&local_58,in_R9);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar4,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,0x68);
    std::__cxx11::string::~string((string *)local_50);
  }
  AVar6 = Diligent::VariableSizeAllocationsManager::Allocate
                    (&this->m_AllocationMgr,alignment_local,alignment);
  Args_1 = (char (*) [126])AVar6.UnalignedOffset;
  msg_1.field_2._8_8_ = Args_1;
  bVar2 = Diligent::VariableSizeAllocationsManager::Allocation::IsValid
                    ((Allocation *)((long)&msg_1.field_2 + 8));
  if (bVar2) {
    tVar5 = Diligent::AlignUp<unsigned_long,unsigned_long>(msg_1.field_2._8_8_,alignment);
    if (AVar6.Size < (tVar5 - msg_1.field_2._8_8_) + alignment_local) {
      Diligent::FormatString<char[26],char[126]>
                ((string *)local_98,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "Diligent::AlignUp(VkDeviceSize{Allocation.UnalignedOffset}, alignment) - Allocation.UnalignedOffset + size <= Allocation.Size"
                 ,Args_1);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      Diligent::DebugAssertionFailed
                (pCVar4,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
                 ,0x6e);
      std::__cxx11::string::~string((string *)local_98);
    }
    VulkanMemoryAllocation::VulkanMemoryAllocation
              (__return_storage_ptr__,this,msg_1.field_2._8_8_,AVar6.Size);
  }
  else {
    VulkanMemoryAllocation::VulkanMemoryAllocation(__return_storage_ptr__);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)((long)&msg.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

VulkanMemoryAllocation VulkanMemoryPage::Allocate(VkDeviceSize size, VkDeviceSize alignment)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};
    VERIFY(size <= std::numeric_limits<AllocationsMgrOffsetType>::max(),
           "Allocation size (", size, ") exceeds maximum allowed value ",
           std::numeric_limits<AllocationsMgrOffsetType>::max());
    auto Allocation = m_AllocationMgr.Allocate(static_cast<AllocationsMgrOffsetType>(size), static_cast<AllocationsMgrOffsetType>(alignment));
    if (Allocation.IsValid())
    {
        // Offset may not necessarily be aligned, but the allocation is guaranteed to be large enough
        // to accommodate requested alignment
        VERIFY_EXPR(Diligent::AlignUp(VkDeviceSize{Allocation.UnalignedOffset}, alignment) - Allocation.UnalignedOffset + size <= Allocation.Size);
        return VulkanMemoryAllocation{this, Allocation.UnalignedOffset, Allocation.Size};
    }
    else
    {
        return VulkanMemoryAllocation{};
    }
}